

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O0

VkResult Fossilize::CreateComputePipelines
                   (VkDevice device,VkPipelineCache pipelineCache,uint32_t createInfoCount,
                   VkComputePipelineCreateInfo *pCreateInfos,VkAllocationCallbacks *pAllocator,
                   VkPipeline *pPipelines)

{
  bool bVar1;
  Device *this;
  Instance *this_00;
  Device *layer;
  VkPipeline *pPipelines_local;
  VkAllocationCallbacks *pAllocator_local;
  VkComputePipelineCreateInfo *pCreateInfos_local;
  uint32_t createInfoCount_local;
  VkPipelineCache pipelineCache_local;
  VkDevice device_local;
  
  this = get_device_layer(device);
  this_00 = Device::getInstance(this);
  bVar1 = Instance::capturesParanoid(this_00);
  if (bVar1) {
    device_local._4_4_ =
         CreateComputePipelinesParanoid
                   (this,device,pipelineCache,createInfoCount,pCreateInfos,pAllocator,pPipelines);
  }
  else {
    device_local._4_4_ =
         CreateComputePipelinesNormal
                   (this,device,pipelineCache,createInfoCount,pCreateInfos,pAllocator,pPipelines);
  }
  return device_local._4_4_;
}

Assistant:

static VKAPI_ATTR VkResult VKAPI_CALL CreateComputePipelines(VkDevice device, VkPipelineCache pipelineCache,
                                                             uint32_t createInfoCount,
                                                             const VkComputePipelineCreateInfo *pCreateInfos,
                                                             const VkAllocationCallbacks *pAllocator,
                                                             VkPipeline *pPipelines)
{
	auto *layer = get_device_layer(device);

	if (layer->getInstance()->capturesParanoid())
		return CreateComputePipelinesParanoid(layer, device, pipelineCache, createInfoCount, pCreateInfos, pAllocator, pPipelines);
	else
		return CreateComputePipelinesNormal(layer, device, pipelineCache, createInfoCount, pCreateInfos, pAllocator, pPipelines);
}